

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O2

DetachedBuffer * __thiscall
flatbuffers::vector_downward<unsigned_int>::release
          (DetachedBuffer *__return_storage_ptr__,vector_downward<unsigned_int> *this)

{
  bool bVar1;
  uint uVar2;
  uint8_t *puVar3;
  size_t sVar4;
  uint8_t *puVar5;
  
  bVar1 = this->own_allocator_;
  puVar3 = this->buf_;
  sVar4 = this->reserved_;
  puVar5 = this->cur_;
  uVar2 = this->size_;
  __return_storage_ptr__->allocator_ = this->allocator_;
  __return_storage_ptr__->own_allocator_ = bVar1;
  __return_storage_ptr__->buf_ = puVar3;
  __return_storage_ptr__->reserved_ = sVar4;
  __return_storage_ptr__->cur_ = puVar5;
  __return_storage_ptr__->size_ = (ulong)uVar2;
  if (bVar1 == true) {
    this->allocator_ = (Allocator *)0x0;
    this->own_allocator_ = false;
  }
  this->buf_ = (uint8_t *)0x0;
  clear(this);
  return __return_storage_ptr__;
}

Assistant:

DetachedBuffer release() {
    // allocator ownership (if any) is transferred to DetachedBuffer.
    DetachedBuffer fb(allocator_, own_allocator_, buf_, reserved_, cur_,
                      size());
    if (own_allocator_) {
      allocator_ = nullptr;
      own_allocator_ = false;
    }
    buf_ = nullptr;
    clear();
    return fb;
  }